

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Int32_To_Int8(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt32 *src;
  
  if (count != 0) {
    do {
      *(undefined1 *)destinationBuffer = *(undefined1 *)((long)sourceBuffer + 3);
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int32_To_Int8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt32 *src = (PaInt32*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        *dest = (signed char) ((*src) >> 24);

        src += sourceStride;
        dest += destinationStride;
    }
}